

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O3

int SUNMatZero_Sparse(SUNMatrix A)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  pvVar1 = A->content;
  if (0 < *(int *)((long)pvVar1 + 8)) {
    lVar2 = *(long *)((long)pvVar1 + 0x10);
    lVar4 = *(long *)((long)pvVar1 + 0x20);
    lVar3 = 0;
    do {
      *(undefined8 *)(lVar2 + lVar3 * 8) = 0;
      *(undefined4 *)(lVar4 + lVar3 * 4) = 0;
      lVar3 = lVar3 + 1;
    } while (lVar3 < *(int *)((long)pvVar1 + 8));
  }
  lVar4 = (long)*(int *)((long)pvVar1 + 0xc);
  lVar2 = *(long *)((long)pvVar1 + 0x28);
  if (0 < lVar4) {
    lVar3 = 0;
    do {
      *(undefined4 *)(lVar2 + lVar3 * 4) = 0;
      lVar3 = lVar3 + 1;
      lVar4 = (long)*(int *)((long)pvVar1 + 0xc);
    } while (lVar3 < lVar4);
  }
  *(undefined4 *)(lVar2 + lVar4 * 4) = 0;
  return 0;
}

Assistant:

int SUNMatZero_Sparse(SUNMatrix A)
{
  sunindextype i;

  /* Perform operation */
  for (i=0; i<SM_NNZ_S(A); i++) {
    (SM_DATA_S(A))[i] = ZERO;
    (SM_INDEXVALS_S(A))[i] = 0;
  }
  for (i=0; i<SM_NP_S(A); i++)
    (SM_INDEXPTRS_S(A))[i] = 0;
  (SM_INDEXPTRS_S(A))[SM_NP_S(A)] = 0;
  return SUNMAT_SUCCESS;
}